

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O3

Vec_Int_t * Fra_ImpDerive(Fra_Man_t *p,int nImpMaxLimit,int nImpUseLimit,int fLatchCorr)

{
  int *piVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  void **__ptr;
  void *__ptr_00;
  bool bVar6;
  int iVar7;
  Fra_Sml_t *p_00;
  Vec_Ptr_t *__ptr_01;
  ulong uVar8;
  int *piVar9;
  ulong uVar10;
  Vec_Int_t *pVVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  uint *pSimR;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int *piVar19;
  long lVar20;
  Fra_Man_t *pFVar21;
  int Counter;
  int CostRange;
  timespec ts;
  uint local_ec;
  uint local_e8;
  Vec_Int_t *local_e0;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_bc;
  ulong local_b8;
  int *local_b0;
  Fra_Sml_t *local_a8;
  uint *local_a0;
  int local_98;
  int local_94;
  long local_90;
  Vec_Ptr_t *local_88;
  Fra_Man_t *local_80;
  Fra_Sml_t *local_78;
  timespec local_70;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  void **local_48;
  Fra_Sml_t *local_40;
  Fra_Sml_t *local_38;
  
  iVar7 = clock_gettime(3,&local_70);
  if (iVar7 < 0) {
    local_90 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
    local_90 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_70.tv_sec * -1000000;
  }
  if (0x7fff < p->pManAig->vObjs->nSize) {
    __assert_fail("Aig_ManObjNumMax(p->pManAig) < (1 << 15)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraImp.c"
                  ,0x14c,"Vec_Int_t *Fra_ImpDerive(Fra_Man_t *, int, int, int)");
  }
  if (((nImpMaxLimit < nImpUseLimit) || (nImpMaxLimit < 1)) || (nImpUseLimit < 1)) {
    __assert_fail("nImpMaxLimit > 0 && nImpUseLimit > 0 && nImpUseLimit <= nImpMaxLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraImp.c"
                  ,0x14d,"Vec_Int_t *Fra_ImpDerive(Fra_Man_t *, int, int, int)");
  }
  uVar14 = 0;
  local_a8 = Fra_SmlSimulateComb(p->pManAig,0x40,0);
  p_00 = Fra_SmlSimulateSeq(p->pManAig,p->pPars->nFramesP,0x40,1,1);
  __ptr_01 = Fra_SmlSortUsingOnes(p_00,fLatchCorr);
  uVar8 = 0x800;
  do {
    if (uVar8 < 2) break;
    uVar10 = uVar8;
    do {
      if ((long)__ptr_01->nSize < (long)uVar8) goto LAB_0069d972;
      piVar9 = (int *)__ptr_01->pArray[uVar10 - 1 & 0xffffffff];
      if (*piVar9 != 0) {
        if ((long)__ptr_01->nSize <= (long)uVar8) goto LAB_0069d972;
        piVar5 = (int *)__ptr_01->pArray[uVar8];
        piVar19 = piVar5;
        iVar7 = *piVar5;
        do {
          while (iVar7 != 0) {
            piVar19 = piVar19 + 1;
            uVar14 = uVar14 + 1;
            iVar7 = *piVar19;
          }
          piVar1 = piVar9 + 1;
          piVar9 = piVar9 + 1;
          piVar19 = piVar5;
          iVar7 = *piVar5;
        } while (*piVar1 != 0);
      }
      bVar6 = 2 < (long)uVar10;
      uVar10 = uVar10 - 1;
    } while (bVar6);
    bVar6 = 1 < uVar8;
    uVar8 = uVar8 - 1;
  } while (bVar6);
  local_b0 = (int *)malloc((ulong)(uint)nImpMaxLimit << 2);
  local_e0 = (Vec_Int_t *)malloc(0x10);
  uVar17 = 0x10;
  if (0xe < nImpMaxLimit - 1U) {
    uVar17 = nImpMaxLimit;
  }
  local_e0->nSize = 0;
  local_e0->nCap = uVar17;
  if (uVar17 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((ulong)uVar17 << 2);
  }
  local_e0->pArray = piVar9;
  local_94 = nImpUseLimit;
  local_80 = p;
  if (p_00->nWordsTotal < 1) {
    local_e8 = 1000000000;
    uVar17 = 0;
    local_d0 = 0;
    local_cc = 0;
    local_d4 = 0;
    local_ec = 0;
    uVar8 = 0;
  }
  else {
    uVar10 = (ulong)(uint)(p_00->nWordsTotal << 5);
    local_40 = local_a8 + 1;
    local_38 = p_00 + 1;
    local_e8 = 1000000000;
    local_b8 = 0;
    local_ec = 0;
    local_d4 = 0;
    local_cc = 0;
    local_d0 = 0;
    uVar17 = 0;
    while (uVar8 = local_b8, 1 < (int)uVar10) {
      local_98 = __ptr_01->nSize;
      uVar12 = uVar10;
      local_88 = __ptr_01;
      local_78 = p_00;
      local_50 = uVar10;
      do {
        if (local_98 < (int)uVar12) goto LAB_0069d972;
        local_58 = uVar10 - 1;
        local_48 = local_88->pArray;
        local_a0 = (uint *)local_48[local_58 & 0xffffffff];
        local_60 = uVar10;
        if (*local_a0 != 0) {
          if (local_98 <= (int)uVar12) goto LAB_0069d972;
          do {
            piVar9 = (int *)local_48[uVar12];
            iVar7 = *piVar9;
            while (iVar7 != 0) {
              uVar17 = uVar17 + 1;
              uVar3 = *local_a0;
              iVar15 = p_00->nWordsTotal;
              iVar4 = p_00->nWordsPref;
              if (iVar4 < iVar15) {
                lVar13 = 0;
                do {
                  if ((*(uint *)((long)&local_38->pAig +
                                lVar13 * 4 + (long)(int)(iVar15 * uVar3) * 4 + (long)iVar4 * 4) &
                      ~*(uint *)((long)&local_38->pAig +
                                lVar13 * 4 + (long)(iVar15 * iVar7) * 4 + (long)iVar4 * 4)) != 0) {
                    local_d0 = local_d0 + 1;
                    goto LAB_0069d710;
                  }
                  lVar13 = lVar13 + 1;
                } while (iVar15 - iVar4 != (int)lVar13);
              }
              iVar15 = local_a8->nWordsTotal;
              iVar4 = local_a8->nWordsPref;
              lVar13 = (long)iVar4;
              if (iVar4 < iVar15) {
                lVar20 = 0;
LAB_0069d612:
                if ((*(uint *)((long)&local_40->pAig +
                              lVar20 * 4 + (long)(int)(iVar15 * uVar3) * 4 + lVar13 * 4) &
                    ~*(uint *)((long)&local_40->pAig +
                              lVar20 * 4 + (long)(iVar15 * iVar7) * 4 + lVar13 * 4)) == 0)
                goto code_r0x0069d61e;
                uVar16 = 0;
                do {
                  uVar18 = ~*(uint *)((long)&local_40->pAig +
                                     lVar13 * 4 + (long)(iVar15 * iVar7) * 4) &
                           *(uint *)((long)&local_40->pAig +
                                    lVar13 * 4 + (long)(int)(iVar15 * uVar3) * 4);
                  uVar18 = (uVar18 >> 1 & 0x55555555) + (uVar18 & 0x55555555);
                  uVar18 = (uVar18 >> 2 & 0x33333333) + (uVar18 & 0x33333333);
                  uVar18 = (uVar18 >> 4 & 0x7070707) + (uVar18 & 0x7070707);
                  uVar18 = (uVar18 >> 8 & 0xf000f) + (uVar18 & 0xf000f);
                  uVar16 = uVar16 + (uVar18 >> 0x10) + (uVar18 & 0xffff);
                  lVar13 = lVar13 + 1;
                } while (iVar15 != lVar13);
                local_d4 = local_d4 + 1;
                if ((int)uVar16 <= (int)local_e8) {
                  local_e8 = uVar16;
                }
                local_b0[(int)local_b8] = uVar16;
                if ((int)local_ec <= (int)uVar16) {
                  local_ec = uVar16;
                }
                Vec_IntPush(local_e0,uVar3 | iVar7 << 0x10);
                local_b8 = (ulong)(uint)local_e0->nSize;
                p_00 = local_78;
                if (local_e0->nSize != nImpMaxLimit) goto LAB_0069d710;
                uVar8 = (ulong)(uint)nImpMaxLimit;
                __ptr_01 = local_88;
                goto LAB_0069d7b1;
              }
LAB_0069d626:
              local_cc = local_cc + 1;
              p_00 = local_78;
LAB_0069d710:
              piVar5 = piVar9 + 1;
              piVar9 = piVar9 + 1;
              iVar7 = *piVar5;
            }
            puVar2 = local_a0 + 1;
            local_a0 = local_a0 + 1;
            uVar12 = local_50;
          } while (*puVar2 != 0);
        }
        uVar10 = local_58;
      } while (2 < (int)local_60);
      uVar10 = uVar12 - 1;
      uVar8 = local_b8;
      __ptr_01 = local_88;
      if ((int)uVar12 < 2) break;
    }
  }
LAB_0069d7b1:
  Fra_SmlStop(local_a8);
  Fra_SmlStop(p_00);
  piVar9 = local_b0;
  local_bc = local_e8;
  pFVar21 = local_80;
  if (local_94 < (int)uVar8) {
    pVVar11 = Fra_SmlSelectMaxCost(local_e0,local_b0,0x800,local_94,(int *)&local_bc);
    pFVar21 = local_80;
    if (local_e0->pArray != (int *)0x0) {
      free(local_e0->pArray);
    }
    free(local_e0);
    local_e0 = pVVar11;
  }
  if (piVar9 != (int *)0x0) {
    free(piVar9);
  }
  if (0 < __ptr_01->nSize) {
    __ptr = __ptr_01->pArray;
    __ptr_00 = *__ptr;
    if (__ptr_00 != (void *)0x0) {
      free(__ptr_00);
    }
    free(__ptr);
    free(__ptr_01);
    qsort(local_e0->pArray,(long)local_e0->nSize,4,Sml_CompareMaxId);
    if (pFVar21->pPars->fVerbose != 0) {
      printf("Implications: All = %d. Try = %d. NonSeq = %d. Comb = %d. Res = %d.\n",(ulong)uVar14,
             (ulong)uVar17,(ulong)local_d0,(ulong)local_cc,(ulong)local_d4);
      iVar7 = 0xa2f133;
      printf("Implication weight: Min = %d. Pivot = %d. Max = %d.   ",(ulong)local_e8,
             (ulong)local_bc,(ulong)local_ec);
      Abc_Print(iVar7,"%s =","Time");
      iVar15 = 3;
      iVar7 = clock_gettime(3,&local_70);
      if (iVar7 < 0) {
        lVar13 = -1;
      }
      else {
        lVar13 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
      }
      Abc_Print(iVar15,"%9.2f sec\n",(double)(lVar13 + local_90) / 1000000.0);
    }
    return local_e0;
  }
LAB_0069d972:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
code_r0x0069d61e:
  lVar20 = lVar20 + 1;
  if (iVar15 - iVar4 == (int)lVar20) goto LAB_0069d626;
  goto LAB_0069d612;
}

Assistant:

Vec_Int_t * Fra_ImpDerive( Fra_Man_t * p, int nImpMaxLimit, int nImpUseLimit, int fLatchCorr )
{
    int nSimWords = 64;
    Fra_Sml_t * pSeq, * pComb;
    Vec_Int_t * vImps, * vTemp;
    Vec_Ptr_t * vNodes;
    int * pImpCosts, * pNodesI, * pNodesK;
    int nImpsTotal = 0, nImpsTried = 0, nImpsNonSeq = 0, nImpsComb = 0, nImpsCollected = 0;
    int CostMin = ABC_INFINITY, CostMax = 0;
    int i, k, Imp, CostRange;
    abctime clk = Abc_Clock();
    assert( Aig_ManObjNumMax(p->pManAig) < (1 << 15) );
    assert( nImpMaxLimit > 0 && nImpUseLimit > 0 && nImpUseLimit <= nImpMaxLimit );
    // normalize both managers
    pComb = Fra_SmlSimulateComb( p->pManAig, nSimWords, 0 );
    pSeq = Fra_SmlSimulateSeq( p->pManAig, p->pPars->nFramesP, nSimWords, 1, 1 );
    // get the nodes sorted by the number of 1s
    vNodes = Fra_SmlSortUsingOnes( pSeq, fLatchCorr );
    // count the total number of implications
    for ( k = nSimWords * 32; k > 0; k-- )
    for ( i = k - 1; i > 0; i-- )
    for ( pNodesI = (int *)Vec_PtrEntry( vNodes, i ); *pNodesI; pNodesI++ )
    for ( pNodesK = (int *)Vec_PtrEntry( vNodes, k ); *pNodesK; pNodesK++ )
        nImpsTotal++;

    // compute implications and their costs
    pImpCosts = ABC_ALLOC( int, nImpMaxLimit );
    vImps = Vec_IntAlloc( nImpMaxLimit );
    for ( k = pSeq->nWordsTotal * 32; k > 0; k-- )
        for ( i = k - 1; i > 0; i-- )
        {
            // HERE WE ARE MISSING SOME POTENTIAL IMPLICATIONS (with complement!)

            for ( pNodesI = (int *)Vec_PtrEntry( vNodes, i ); *pNodesI; pNodesI++ )
            for ( pNodesK = (int *)Vec_PtrEntry( vNodes, k ); *pNodesK; pNodesK++ )
            {
                nImpsTried++;
                if ( !Sml_NodeCheckImp(pSeq, *pNodesI, *pNodesK) )
                {
                    nImpsNonSeq++;
                    continue;
                }
                if ( Sml_NodeCheckImp(pComb, *pNodesI, *pNodesK) )
                {
                    nImpsComb++;
                    continue;
                }
                nImpsCollected++;
                Imp = Fra_ImpCreate( *pNodesI, *pNodesK );
                pImpCosts[ Vec_IntSize(vImps) ] = Sml_NodeNotImpWeight(pComb, *pNodesI, *pNodesK);
                CostMin = Abc_MinInt( CostMin, pImpCosts[ Vec_IntSize(vImps) ] );
                CostMax = Abc_MaxInt( CostMax, pImpCosts[ Vec_IntSize(vImps) ] );
                Vec_IntPush( vImps, Imp );
                if ( Vec_IntSize(vImps) == nImpMaxLimit )
                    goto finish;
            } 
        }
finish:
    Fra_SmlStop( pComb );
    Fra_SmlStop( pSeq );

    // select implications with the highest cost
    CostRange = CostMin;
    if ( Vec_IntSize(vImps) > nImpUseLimit )
    {
        vImps = Fra_SmlSelectMaxCost( vTemp = vImps, pImpCosts, nSimWords * 32, nImpUseLimit, &CostRange );
        Vec_IntFree( vTemp );  
    }

    // dealloc
    ABC_FREE( pImpCosts ); 
    {
    void * pTemp = Vec_PtrEntry(vNodes, 0);
    ABC_FREE( pTemp );
    }
    Vec_PtrFree( vNodes );
    // reorder implications topologically
    qsort( (void *)Vec_IntArray(vImps), (size_t)Vec_IntSize(vImps), sizeof(int), 
            (int (*)(const void *, const void *)) Sml_CompareMaxId );
if ( p->pPars->fVerbose )
{
printf( "Implications: All = %d. Try = %d. NonSeq = %d. Comb = %d. Res = %d.\n", 
    nImpsTotal, nImpsTried, nImpsNonSeq, nImpsComb, nImpsCollected );
printf( "Implication weight: Min = %d. Pivot = %d. Max = %d.   ", 
       CostMin, CostRange, CostMax );
ABC_PRT( "Time", Abc_Clock() - clk );
}
    return vImps;
}